

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueSetFilterParameters
               (FAudioVoice *voice,FAudioFilterParameters *pParameters,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Type in_EDX;
  FAudioVoice *in_RSI;
  FAudio_OPERATIONSET_Operation *op;
  uint32_t in_stack_ffffffffffffffe8;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x1351f3);
  pFVar1 = QueueOperation(in_RSI,in_EDX,in_stack_ffffffffffffffe8);
  SDL_memcpy(&pFVar1->Data,in_RSI,0xc);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x135234);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetFilterParameters(
	FAudioVoice *voice,
	const FAudioFilterParameters *pParameters,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETFILTERPARAMETERS,
		OperationSet
	);

	FAudio_memcpy(
		&op->Data.SetFilterParameters.Parameters,
		pParameters,
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}